

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::ToVarStackSym(GlobOpt *this,StackSym *varSym,BasicBlock *block)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((varSym->field_0x1a & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x303b,"(!varSym->IsTypeSpec())","!varSym->IsTypeSpec()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  BVSparse<Memory::JitArenaAllocator>::Set
            ((block->globOptData).liveVarSyms,(varSym->super_Sym).m_id);
  BVSparse<Memory::JitArenaAllocator>::Clear
            ((block->globOptData).liveInt32Syms,(varSym->super_Sym).m_id);
  BVSparse<Memory::JitArenaAllocator>::Clear
            ((block->globOptData).liveLossyInt32Syms,(varSym->super_Sym).m_id);
  BVSparse<Memory::JitArenaAllocator>::Clear
            ((block->globOptData).liveFloat64Syms,(varSym->super_Sym).m_id);
  return;
}

Assistant:

void
GlobOpt::ToVarStackSym(StackSym *varSym, BasicBlock *block)
{
    //added another check for sym , in case of asmjs there is mostly no var syms and hence added a new check to see if it is the primary sym
    Assert(!varSym->IsTypeSpec());

    block->globOptData.liveVarSyms->Set(varSym->m_id);
    block->globOptData.liveInt32Syms->Clear(varSym->m_id);
    block->globOptData.liveLossyInt32Syms->Clear(varSym->m_id);
    block->globOptData.liveFloat64Syms->Clear(varSym->m_id);
}